

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrLDY0xac(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  uint16_t uVar2;
  byte bVar3;
  
  this_00 = this->m;
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this_00,uVar2);
  uVar1 = Memory::Read8(this_00,uVar2);
  this->Y = uVar1;
  if (uVar1 == '\0') {
    bVar3 = this->field_0x2e | 0x40;
  }
  else {
    bVar3 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar3 = bVar3 | 1;
      goto LAB_0010e9b7;
    }
  }
  bVar3 = bVar3 & 0xfe;
LAB_0010e9b7:
  this->field_0x2e = bVar3;
  return 4;
}

Assistant:

int CPU::instrLDY0xac() {
	LDY(absolute_addr());
	return 4;
}